

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmframe.cpp
# Opt level: O2

VMFrame * __thiscall
VMFrameStack::AllocFrame(VMFrameStack *this,int numregd,int numregf,int numregs,int numrega)

{
  VMFrame *this_00;
  int iVar1;
  
  if (0xfe < (uint)numregd) {
    __assert_fail("(unsigned)numregd < 255",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/vmframe.cpp"
                  ,200,"VMFrame *VMFrameStack::AllocFrame(int, int, int, int)");
  }
  if (0xfe < (uint)numregf) {
    __assert_fail("(unsigned)numregf < 255",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/vmframe.cpp"
                  ,0xc9,"VMFrame *VMFrameStack::AllocFrame(int, int, int, int)");
  }
  if (0xfe < (uint)numregs) {
    __assert_fail("(unsigned)numregs < 255",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/vmframe.cpp"
                  ,0xca,"VMFrame *VMFrameStack::AllocFrame(int, int, int, int)");
  }
  if ((uint)numrega < 0xff) {
    iVar1 = numregd + numrega + numregs + numregf;
    this_00 = Alloc(this,iVar1 * 0x10 + numrega * 9 + numregd * 4 + (numregs + numregf) * 8 + 0x20);
    this_00->NumRegD = (VM_UBYTE)numregd;
    this_00->NumRegF = (VM_UBYTE)numregf;
    this_00->NumRegS = (VM_UBYTE)numregs;
    this_00->NumRegA = (VM_UBYTE)numrega;
    this_00->MaxParam = (VM_UHALF)iVar1;
    VMFrame::InitRegS(this_00);
    return this_00;
  }
  __assert_fail("(unsigned)numrega < 255",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/vmframe.cpp"
                ,0xcb,"VMFrame *VMFrameStack::AllocFrame(int, int, int, int)");
}

Assistant:

VMFrame *VMFrameStack::AllocFrame(int numregd, int numregf, int numregs, int numrega)
{
	assert((unsigned)numregd < 255);
	assert((unsigned)numregf < 255);
	assert((unsigned)numregs < 255);
	assert((unsigned)numrega < 255);
	// To keep the arguments to this function simpler, it assumes that every
	// register might be used as a parameter for a single call.
	int numparam = numregd + numregf + numregs + numrega;
	int size = VMFrame::FrameSize(numregd, numregf, numregs, numrega, numparam, 0);
	VMFrame *frame = Alloc(size);
	frame->NumRegD = numregd;
	frame->NumRegF = numregf;
	frame->NumRegS = numregs;
	frame->NumRegA = numrega;
	frame->MaxParam = numparam;
	frame->InitRegS();
	return frame;
}